

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O2

Dataset * __thiscall
notch::io::IDXReader::readDataset
          (Dataset *__return_storage_ptr__,IDXReader *this,istream *in,size_t *dims,size_t *shape)

{
  size_type __n;
  size_t dims_00;
  runtime_error *this_00;
  ulong uVar1;
  size_type sVar2;
  size_type sVar3;
  ulong __n_00;
  float local_64;
  Dataset *local_60;
  Array sample;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  
  (__return_storage_ptr__->
  super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60 = __return_storage_ptr__;
  dims_00 = readDims(this,in);
  *dims = dims_00;
  readShape(this,in,dims_00,shape);
  __n = *shape;
  uVar1 = 1;
  __n_00 = uVar1;
  for (; uVar1 < *dims; uVar1 = uVar1 + 1) {
    __n_00 = __n_00 * shape[uVar1];
  }
  core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::reserve
            (local_60,__n);
  sample._M_size._0_1_ = 0;
  core::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&buf,__n_00,(value_type_conflict1 *)&sample,(allocator_type *)&local_64);
  sVar3 = 0;
  while( true ) {
    if (sVar3 == __n) {
      core::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      return local_60;
    }
    local_64 = 0.0;
    core::std::valarray<float>::valarray(&sample,&local_64,__n_00);
    std::istream::read((char *)in,
                       (long)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    if (*(size_type *)(in + 8) != __n_00) break;
    for (sVar2 = 0; __n_00 != sVar2; sVar2 = sVar2 + 1) {
      sample._M_data[sVar2] =
           (float)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start[sVar2];
    }
    core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::push_back
              (local_60,&sample);
    operator_delete(sample._M_data);
    sVar3 = sVar3 + 1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"IDXReader: cannot read data sample");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Dataset readDataset(std::istream &in, size_t *dims, size_t shape[]) {
        Dataset dataset;
        // read shape information
        *dims = readDims(in);
        readShape(in, *dims, shape);
        // calculate sample size in bytes
        size_t nSamples = shape[0];
        size_t nSampleSize = sizeof(uint8_t);
        for (size_t i = 1; i < *dims; ++i) {
            nSampleSize *= shape[i];
        }
        // read all samples
        dataset.reserve(nSamples);
        std::vector<uint8_t> buf(nSampleSize, 0);
        for (size_t i = 0; i < nSamples; ++i) {
            Array sample(0.0, nSampleSize);
            in.read((char*)buf.data(), nSampleSize);
            size_t n = in.gcount();
            if (n != nSampleSize) {
                throw std::runtime_error("IDXReader: cannot read data sample");
            }
            for (size_t j = 0; j < nSampleSize; ++j) {
                sample[j] = buf[j]; // convert uint8_t to float
            }
            dataset.push_back(sample);
        }
        return dataset;
    }